

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_views.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBViewsInit(ClientContext *context,TableFunctionInitInput *input)

{
  long *plVar1;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  _Var2;
  pointer *__ptr;
  pointer prVar3;
  long *local_78;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  local_70;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
        )(tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )context;
  make_uniq<duckdb::DuckDBViewsData>();
  Catalog::GetAllSchemas(&schemas,(ClientContext *)input);
  for (prVar3 = schemas.
                super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
      .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
           local_70._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
           .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl,
      plVar1 = local_78,
      prVar3 != schemas.
                super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; prVar3 = prVar3 + 1) {
    local_50._8_8_ = 0;
    local_38 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_views.cpp:68:21)>
               ::_M_invoke;
    local_40 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_views.cpp:68:21)>
               ::_M_manager;
    local_50._M_unused._M_object = &local_78;
    (*(prVar3->_M_data->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
              (prVar3->_M_data,input,3,&local_50);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  }
  local_78 = (long *)0x0;
  *(long **)local_70._M_t.
            super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl = plVar1;
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                   *)&schemas);
  if (local_78 != (long *)0x0) {
    (**(code **)(*local_78 + 8))();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var2._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBViewsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBViewsData>();

	// scan all the schemas for tables and collect them and collect them
	auto schemas = Catalog::GetAllSchemas(context);
	for (auto &schema : schemas) {
		schema.get().Scan(context, CatalogType::VIEW_ENTRY,
		                  [&](CatalogEntry &entry) { result->entries.push_back(entry); });
	};
	return std::move(result);
}